

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions_detail.hpp
# Opt level: O3

bool chaiscript::dispatch::detail::
     compare_types_cast<bool,henson::NameMap_const&,std::__cxx11::string_const&,0ul,1ul>
               (undefined8 param_1,long *param_2,Type_Conversions_State *param_3)

{
  boxed_cast<henson::NameMap_const&>((Boxed_Value *)*param_2,param_3);
  boxed_cast<std::__cxx11::string_const&>((Boxed_Value *)(*param_2 + 0x10),param_3);
  return true;
}

Assistant:

bool compare_types_cast(Indexes<I...>, Ret (*)(Params...),
             const std::vector<Boxed_Value> &params, const Type_Conversions_State &t_conversions)
        {
          try {
            (void)params; (void)t_conversions;
            (void)std::initializer_list<int>{(boxed_cast<Params>(params[I], &t_conversions), 0)...};
            return true;
          } catch (const exception::bad_boxed_cast &) {
            return false;
          }

        }